

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cc
# Opt level: O0

bool woff2::NormalizeOffsets(Font *font)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  mapped_type *pmVar4;
  mapped_type *table;
  iterator iStack_48;
  uint tag;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint32_t offset;
  Font *font_local;
  
  __range1._4_4_ = (uint)font->num_tables * 0x10 + 0xc;
  Font::OutputOrderedTags((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1,font);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  iStack_48 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    table._4_4_ = *puVar3;
    pmVar4 = std::
             map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
             ::operator[](&font->tables,(key_type *)((long)&table + 4));
    pmVar4->offset = __range1._4_4_;
    uVar2 = Round4<unsigned_int>(pmVar4->length);
    __range1._4_4_ = uVar2 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__begin1);
  return true;
}

Assistant:

bool NormalizeOffsets(Font* font) {
  uint32_t offset = 12 + 16 * font->num_tables;
  for (auto tag : font->OutputOrderedTags()) {
    auto& table = font->tables[tag];
    table.offset = offset;
    offset += Round4(table.length);
  }
  return true;
}